

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O1

Vec_Int_t * Acec_MultDetectInputs(Gia_Man_t *p,Vec_Wec_t *vLeafLits,Vec_Wec_t *vRootLits)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Int_t *vSupp;
  Vec_Wrd_t *vTemp;
  word *__s;
  void *__s_00;
  void *__s_01;
  Vec_Int_t *pVVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  word Truth;
  word local_38;
  
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  vSupp = (Vec_Int_t *)malloc(0x10);
  vSupp->nCap = 100;
  vSupp->nSize = 0;
  piVar5 = (int *)malloc(400);
  vSupp->pArray = piVar5;
  uVar2 = p->nObjs;
  lVar11 = (long)(int)uVar2;
  vTemp = (Vec_Wrd_t *)malloc(0x10);
  uVar8 = 0x10;
  if (0xe < uVar2 - 1) {
    uVar8 = uVar2;
  }
  vTemp->nSize = 0;
  vTemp->nCap = uVar8;
  lVar7 = (long)(int)uVar8;
  if (uVar8 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc(lVar7 * 8);
  }
  vTemp->pArray = __s;
  vTemp->nSize = uVar2;
  __s_00 = (void *)0x0;
  memset(__s,0,lVar11 * 8);
  if (uVar8 != 0) {
    __s_00 = malloc(lVar7 * 4);
  }
  if (__s_00 != (void *)0x0) {
    memset(__s_00,0,lVar11 * 4);
  }
  if (uVar8 == 0) {
    __s_01 = (void *)0x0;
  }
  else {
    __s_01 = malloc(lVar7 << 2);
  }
  if (__s_01 != (void *)0x0) {
    memset(__s_01,0,lVar11 << 2);
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(p);
  pVVar6 = p->vCis;
  if (0 < pVVar6->nSize) {
    lVar11 = 0;
    do {
      iVar3 = pVVar6->pArray[lVar11];
      lVar7 = (long)iVar3;
      if ((lVar7 < 0) || (p->nObjs <= iVar3)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar3 == 0) break;
      printf("%d=%d ",lVar7,(ulong)(uint)p->pRefs[lVar7]);
      lVar11 = lVar11 + 1;
      pVVar6 = p->vCis;
    } while (lVar11 < pVVar6->nSize);
  }
  putchar(10);
  if (0 < p->nObjs) {
    lVar11 = 0;
    uVar9 = 0;
    do {
      uVar8 = *(uint *)(&p->pObjs->field_0x0 + lVar11);
      if (((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) && (3 < p->pRefs[uVar9])) {
        printf("%d=%d ",uVar9 & 0xffffffff);
      }
      uVar9 = uVar9 + 1;
      lVar11 = lVar11 + 0xc;
    } while ((long)uVar9 < (long)p->nObjs);
  }
  putchar(10);
  if (0 < vLeafLits->nSize) {
    uVar9 = 0;
    do {
      pVVar6 = vLeafLits->pArray;
      if (0 < pVVar6[uVar9].nSize) {
        uVar10 = 0;
        do {
          uVar8 = pVVar6[uVar9].pArray[uVar10];
          local_38 = Gia_ObjComputeTruth6Cis(p,uVar8,vSupp,vTemp);
          if (-1 < vSupp->nSize) {
            if ((int)uVar8 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            printf("Leaf = %4d : ",(ulong)(uVar8 >> 1));
            printf("Rank = %2d  ",uVar9 & 0xffffffff);
            printf("Supp = %2d  ",(ulong)(uint)vSupp->nSize);
            Extra_PrintHex(_stdout,(uint *)&local_38,vSupp->nSize);
            if (vSupp->nSize == 4) {
              printf("    ");
            }
            if (vSupp->nSize == 3) {
              printf("      ");
            }
            if (vSupp->nSize < 3) {
              printf("       ");
            }
            printf("  ");
            printf("Vector has %d entries: {",(ulong)(uint)vSupp->nSize);
            if (0 < vSupp->nSize) {
              lVar11 = 0;
              do {
                printf(" %d",(ulong)(uint)vSupp->pArray[lVar11]);
                lVar11 = lVar11 + 1;
              } while (lVar11 < vSupp->nSize);
            }
            puts(" }");
          }
          iVar3 = vSupp->nSize;
          if (0 < (long)iVar3) {
            piVar5 = vSupp->pArray;
            lVar11 = 0;
            do {
              lVar7 = (long)piVar5[lVar11];
              if ((lVar7 < 0) || ((int)uVar2 <= piVar5[lVar11])) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
              }
              piVar1 = (int *)((long)__s_00 + lVar7 * 4);
              *piVar1 = *piVar1 + (int)uVar9;
              piVar1 = (int *)((long)__s_01 + lVar7 * 4);
              *piVar1 = *piVar1 + 1;
              lVar11 = lVar11 + 1;
            } while (iVar3 != lVar11);
          }
          if (uVar10 == pVVar6[uVar9].nSize - 1) {
            putchar(10);
          }
          uVar10 = uVar10 + 1;
        } while ((long)uVar10 < (long)pVVar6[uVar9].nSize);
      }
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)vLeafLits->nSize);
  }
  if (0 < (int)uVar2) {
    uVar9 = 0;
    do {
      iVar3 = *(int *)((long)__s_01 + uVar9 * 4);
      if (iVar3 != 0) {
        printf("%d=%d(%.2f) ",(double)*(int *)((long)__s_00 + uVar9 * 4) / (double)iVar3,
               uVar9 & 0xffffffff);
      }
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
  }
  putchar(10);
  if (vSupp->pArray != (int *)0x0) {
    free(vSupp->pArray);
    vSupp->pArray = (int *)0x0;
  }
  free(vSupp);
  if (vTemp->pArray != (word *)0x0) {
    free(vTemp->pArray);
    vTemp->pArray = (word *)0x0;
  }
  free(vTemp);
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  if (__s_01 != (void *)0x0) {
    free(__s_01);
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Acec_MultDetectInputs( Gia_Man_t * p, Vec_Wec_t * vLeafLits, Vec_Wec_t * vRootLits )
{
    Vec_Int_t * vInputs = Vec_IntAlloc( 100 );
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    Vec_Wrd_t * vTemp = Vec_WrdStart( Gia_ManObjNum(p) );
    Vec_Int_t * vRanks  = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vCounts = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel;
    int i, k, iLit, iObj, j, Entry;

    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p );
    Gia_ManForEachCiId( p, iObj, i )
        printf( "%d=%d ", iObj, Gia_ObjRefNumId(p, iObj) );
    printf( "\n" );
    Gia_ManForEachAndId( p, iObj )
        if ( Gia_ObjRefNumId(p, iObj) >= 4 )
            printf( "%d=%d ", iObj, Gia_ObjRefNumId(p, iObj) );
    printf( "\n" );

    Vec_WecForEachLevel( vLeafLits, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
        {
            word Truth = Gia_ObjComputeTruth6Cis( p, iLit, vSupp, vTemp );
            if ( Vec_IntSize(vSupp) >= 0 )
            {
                printf( "Leaf = %4d : ", Abc_Lit2Var(iLit) );
                printf( "Rank = %2d  ", i );
                printf( "Supp = %2d  ", Vec_IntSize(vSupp) );
                Extra_PrintHex( stdout, (unsigned*)&Truth, Vec_IntSize(vSupp) );
                if ( Vec_IntSize(vSupp) == 4 ) printf( "    " );
                if ( Vec_IntSize(vSupp) == 3 ) printf( "      " );
                if ( Vec_IntSize(vSupp) <= 2 ) printf( "       " );
                printf( "  " );
                Vec_IntPrint( vSupp );
                /*
                if ( Truth == 0xF335ACC0F335ACC0 )
                {
                    int iObj = Abc_Lit2Var(iLit);
                    Gia_Man_t * pGia0 = Gia_ManDupAndCones( p, &iObj, 1, 1 );
                    Gia_ManShow( pGia0, NULL, 0, 0, 0 );
                    Gia_ManStop( pGia0 );
                }
                */
            }
            // support rank counts
            Vec_IntForEachEntry( vSupp, Entry, j )
            {
                Vec_IntAddToEntry( vRanks, Entry, i );
                Vec_IntAddToEntry( vCounts, Entry, 1 );
            }
            if ( k == Vec_IntSize(vLevel)-1 )
                printf( "\n" );
        }

    Vec_IntForEachEntry( vCounts, Entry, j )
        if ( Entry )
            printf( "%d=%d(%.2f) ", j, Entry, 1.0*Vec_IntEntry(vRanks, j)/Entry );
    printf( "\n" );

    Vec_IntFree( vSupp );
    Vec_WrdFree( vTemp );
    Vec_IntFree( vRanks );
    Vec_IntFree( vCounts );
    return vInputs;
}